

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource_private.hh
# Opt level: O2

bool __thiscall InputSource::fastRead(InputSource *this,char *ch)

{
  long lVar1;
  long lVar2;
  
  while( true ) {
    lVar1 = this->buf_len;
    lVar2 = this->buf_idx;
    if (lVar2 < lVar1) break;
    if (lVar1 == 0) goto LAB_001b35b2;
    (*this->_vptr_InputSource[5])(this,lVar1 + this->buf_start,0);
    fastTell(this);
  }
  *ch = this->buffer[lVar2];
  this->buf_idx = this->buf_idx + 1;
  this->last_offset = this->last_offset + 1;
LAB_001b35b2:
  return lVar2 < lVar1;
}

Assistant:

inline bool
InputSource::fastRead(char& ch)
{
    // Before calling fastRead, fastTell must be called to prepare the buffer. Once reading is
    // complete, fastUnread must be called to set the correct file position.
    if (buf_idx < buf_len) {
        ch = buffer[buf_idx];
        ++(buf_idx);
        ++(last_offset);
        return true;

    } else if (buf_len == 0) {
        return false;
    } else {
        seek(buf_start + buf_len, SEEK_SET);
        fastTell();
        return fastRead(ch);
    }
}